

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

bool __thiscall testing::internal::FilePath::CreateFolder(FilePath *this)

{
  int iVar1;
  FilePath *path;
  bool bVar2;
  undefined1 local_a8 [8];
  StatStruct file_stat;
  
  iVar1 = mkdir((this->pathname_)._M_dataplus._M_p,0x1ff);
  bVar2 = true;
  if (iVar1 == -1) {
    memset((stat *)local_a8,0,0x90);
    iVar1 = stat((this->pathname_)._M_dataplus._M_p,(stat *)local_a8);
    bVar2 = ((uint)file_stat.st_nlink & 0xf000) == 0x4000 && iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool FilePath::CreateFolder() const {
#if GTEST_OS_WINDOWS_MOBILE
  FilePath removed_sep(this->RemoveTrailingPathSeparator());
  LPCWSTR unicode = String::AnsiToUtf16(removed_sep.c_str());
  int result = CreateDirectory(unicode, nullptr) ? 0 : -1;
  delete [] unicode;
#elif GTEST_OS_WINDOWS
  int result = _mkdir(pathname_.c_str());
#elif GTEST_OS_ESP8266 || GTEST_OS_XTENSA
  // do nothing
  int result = 0;
#else
  int result = mkdir(pathname_.c_str(), 0777);
#endif  // GTEST_OS_WINDOWS_MOBILE

  if (result == -1) {
    return this->DirectoryExists();  // An error is OK if the directory exists.
  }
  return true;  // No error.
}